

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Mat * rotate(Mat *__return_storage_ptr__,Mat *src,int angle)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  __m128 t_1;
  __m128 t;
  int local_110;
  int local_10c;
  Rect2f bbox;
  float fStack_100;
  float fStack_fc;
  undefined4 local_f0 [2];
  Mat *local_e8;
  undefined8 local_e0;
  undefined4 local_d8 [2];
  Mat *local_d0;
  undefined8 local_c8;
  undefined4 local_c0 [2];
  Mat *local_b8;
  undefined8 local_b0;
  Point2f local_a8;
  undefined1 local_a0 [32];
  Mat rot;
  
  uVar1 = src->rows;
  uVar3 = src->cols;
  local_a8.y = (float)(uVar1 + -1) * 0.5;
  local_a8.x = (float)(uVar3 + -1) * 0.5;
  cv::getRotationMatrix2D(&rot,&local_a8,(double)angle,1.0);
  local_a0._16_4_ = (undefined4)angle;
  local_a0._0_8_ = 0.0;
  uVar2 = *(undefined8 *)(src->size).p;
  local_a0._8_8_ = CONCAT44((float)(int)uVar2,(float)(int)((ulong)uVar2 >> 0x20));
  cv::RotatedRect::boundingRect2f();
  *(double *)(rot.data + 0x10) =
       ((double)fStack_100 * 0.5 - (double)src->cols * 0.5) + *(double *)(rot.data + 0x10);
  *(double *)(rot.data + *rot.step.p + 0x10) =
       ((double)fStack_fc * 0.5 - (double)src->rows * 0.5) +
       *(double *)(rot.data + *rot.step.p + 0x10);
  cv::Mat::Mat(__return_storage_ptr__);
  local_b0 = 0;
  local_c0[0] = 0x1010000;
  local_c8 = 0;
  local_d8[0] = 0x2010000;
  local_e0 = 0;
  local_f0[0] = 0x1010000;
  local_110 = (int)ROUND(fStack_100);
  local_10c = (int)ROUND(fStack_fc);
  local_e8 = &rot;
  local_d0 = __return_storage_ptr__;
  local_b8 = src;
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_a0);
  cv::warpAffine(local_c0,local_d8,local_f0,&local_110,1,0,(Scalar_<double> *)local_a0);
  cv::Mat::~Mat(&rot);
  return __return_storage_ptr__;
}

Assistant:

Mat rotate(Mat src,int angle){
    Point2f center((src.cols-1)/2.0, (src.rows-1)/2.0);
    Mat rot = getRotationMatrix2D(center, angle, 1.0);
    Rect2f bbox = RotatedRect(cv::Point2f(), src.size(), angle).boundingRect2f();
    rot.at<double>(0,2) += bbox.width/2.0 - src.cols/2.0;
    rot.at<double>(1,2) += bbox.height/2.0 - src.rows/2.0;
    Mat final_img;
    warpAffine(src, final_img, rot, bbox.size());
    return final_img;
}